

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_jpeg.h
# Opt level: O1

int tje_encode_to_file(char *dest_path,int width,int height,int num_components,_Bool Rgb,
                      uchar *src_data)

{
  uchar uVar1;
  int iVar2;
  uchar *src_data_00;
  uchar *puVar3;
  ulong uVar4;
  long lVar5;
  uchar *puVar6;
  
  if (num_components == 1) {
    src_data_00 = (uchar *)malloc((long)(width * height * 3));
    if (src_data_00 == (uchar *)0x0) {
      iVar2 = 0;
    }
    else {
      if (0 < height) {
        puVar3 = src_data_00 + 2;
        uVar4 = 0;
        do {
          if (0 < width) {
            lVar5 = 0;
            puVar6 = src_data;
            do {
              uVar1 = *puVar6;
              puVar3[lVar5] = uVar1;
              puVar3[lVar5 + -1] = uVar1;
              puVar3[lVar5 + -2] = uVar1;
              puVar6 = puVar6 + 1;
              lVar5 = lVar5 + 3;
            } while ((ulong)(uint)width * 3 != lVar5);
          }
          uVar4 = uVar4 + 1;
          src_data = src_data + width;
          puVar3 = puVar3 + (long)width * 3;
        } while (uVar4 != (uint)height);
      }
      iVar2 = tje_encode_to_file_at_quality(dest_path,3,width,height,3,Rgb,src_data_00);
      free(src_data_00);
    }
  }
  else {
    iVar2 = tje_encode_to_file_at_quality(dest_path,3,width,height,num_components,Rgb,src_data);
  }
  return iVar2;
}

Assistant:

int tje_encode_to_file(const char* dest_path,
                       const int width,
                       const int height,
                       const int num_components,
					   bool Rgb,
                       const unsigned char* src_data)
{
	if (num_components == 1)
	{
		unsigned char*  dst_data = (unsigned char*)malloc(width*height * 3);
		if (dst_data == NULL) return 0;
		for (int y = 0; y < height; y++)
		{
			const unsigned char*     inLine = src_data + (y * width);
			unsigned char*     outLine = dst_data + (y * width * 3);

			for (int x = 0; x < width; x++)
			{
				outLine[0] = outLine[1] = outLine[2] = inLine[x];

				outLine += 3;
			}
		}
		int res = tje_encode_to_file_at_quality(dest_path, 3, width, height, 3,  Rgb, dst_data);
		free(dst_data);
		return res;
	}
	else
	{ 
		int res = tje_encode_to_file_at_quality(dest_path, 3, width, height, num_components, Rgb, src_data);
		return res;
	}
}